

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
flatbuffers::NewDartCodeGenerator(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
  in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x28);
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[1] = puVar1 + 3;
  *(undefined1 *)(puVar1 + 3) = 0;
  *puVar1 = &PTR__CodeGenerator_003e8c08;
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
   ._M_t.
   super__Tuple_impl<0UL,_flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>
   .super__Head_base<0UL,_flatbuffers::CodeGenerator_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
          )(tuple<flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>)
           in_RDI.
           super___uniq_ptr_impl<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>
           .super__Head_base<0UL,_flatbuffers::CodeGenerator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CodeGenerator> NewDartCodeGenerator() {
  return std::unique_ptr<DartCodeGenerator>(new DartCodeGenerator());
}